

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O3

bool __thiscall
Lib::
FilteredIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:750:15),_false>
::hasNext(FilteredIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:750:15),_false>
          *this)

{
  Option<Lib::VirtualIterator<Inferences::InductionContext>_> *this_00;
  pointer ppTVar1;
  long *plVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
  *this_01;
  _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_02;
  char cVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>
  *pFVar10;
  uint uVar11;
  Value unaff_RBP;
  __node_base _Var12;
  Value local_158;
  uint local_14c;
  OptionBase<Inferences::InductionContext> *local_148;
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>
  *local_140;
  InductionContext local_138;
  pointer local_e8;
  undefined1 auStack_e0 [88];
  pointer local_88;
  Value VStack_80;
  pointer local_78;
  _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_70;
  
  pFVar10 = (FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>
             *)0x1;
  if ((this->_next).super_OptionBase<Inferences::InductionContext>._isSome == false) {
    local_148 = &(this->_next).super_OptionBase<Inferences::InductionContext>;
    pFVar10 = &this->_inn;
    this_00 = &(this->_inn)._current;
    local_140 = pFVar10;
    do {
      bVar7 = (this_00->super_OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>).
              _isSome;
      if (bVar7 != true) {
LAB_004e0ec6:
        pFVar10 = (FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>
                   *)0x0;
        break;
      }
      local_14c = (uint)CONCAT71((int7)((ulong)pFVar10 >> 8),bVar7);
      while (cVar6 = (**(code **)(*(long *)(this->_inn)._current.
                                           super_OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>
                                           ._elem._elem + 0x10))(), cVar6 == '\0') {
        bVar7 = FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>
                ::hasNext(&(this->_inn)._master._inner);
        if (bVar7) {
          MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>
          ::next((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>
                  *)&local_158.init);
          unaff_RBP = local_158;
          if (local_158 == (Value)0x0) {
            local_e8 = (pointer)CONCAT71(local_e8._1_7_,1);
            auStack_e0._0_8_ = (Value)0x0;
            unaff_RBP = (Value)0x0;
          }
          else {
            local_e8 = (pointer)CONCAT71(local_e8._1_7_,1);
            auStack_e0._0_8_ = local_158;
            iVar9 = *(int *)((long)local_158 + 8) + 2;
            *(int *)((long)local_158 + 8) = iVar9;
            if (iVar9 == 0) {
              (**(code **)(*(long *)local_158 + 8))(local_158);
            }
          }
        }
        else {
          local_e8 = (pointer)0x0;
          auStack_e0._0_8_ = (Value)0x0;
        }
        OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>::operator=
                  (&this_00->super_OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>,
                   (OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_> *)&local_e8);
        if ((local_e8._0_1_ == true) && ((Value)auStack_e0._0_8_ != (Value)0x0)) {
          ppTVar1 = (pointer)(auStack_e0._0_8_ + 8);
          *(int *)ppTVar1 = *(int *)ppTVar1 + -1;
          if (*(int *)ppTVar1 == 0) {
            (**(code **)&(*(Term **)auStack_e0._0_8_)->_functor)();
          }
        }
        if (bVar7) {
          if (unaff_RBP != (Value)0x0) {
            plVar2 = (long *)((long)unaff_RBP + 8);
            *(int *)plVar2 = *(int *)plVar2 + -1;
            if (*(int *)plVar2 == 0) {
              (**(code **)(*(long *)unaff_RBP + 8))(unaff_RBP);
            }
          }
          if (local_158 != (Value)0x0) {
            plVar2 = (long *)((long)local_158 + 8);
            *(int *)plVar2 = *(int *)plVar2 + -1;
            if (*(int *)plVar2 == 0) {
              (**(code **)(*(long *)local_158 + 8))();
            }
          }
        }
        if ((this_00->super_OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>)._isSome
            == false) goto LAB_004e0ec6;
      }
      (**(code **)(*(long *)(this->_inn)._current.
                            super_OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>.
                            _elem._elem + 0x18))
                ((OptionBase<Inferences::InductionContext> *)&local_e8);
      local_138._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
      _M_impl.super__Vector_impl_data._M_start = local_e8;
      local_138._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_e0._0_8_;
      local_138._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_e0._8_8_;
      local_e8 = (pointer)0x0;
      auStack_e0._0_8_ = (Value)0x0;
      auStack_e0._8_8_ = (pointer)0x0;
      this_02 = (_Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(auStack_e0 + 0x10);
      std::
      _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&local_138._cls._M_h,this_02,this_02);
      std::
      _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(this_02);
      if (local_e8 != (pointer)0x0) {
        operator_delete(local_e8,auStack_e0._8_8_ - (long)local_e8);
      }
      local_88 = local_138._indTerms.
                 super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      VStack_80 = (Value)local_138._indTerms.
                         super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl
                         .super__Vector_impl_data._M_finish;
      local_78 = local_138._indTerms.
                 super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_138._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_138._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_01 = &local_138._cls;
      std::
      _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&local_70,this_01,this_01);
      std::
      _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&this_01->_M_h);
      if (local_138._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138._indTerms.
                        super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_138._indTerms.
                              super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_138._indTerms.
                              super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      unaff_RBP._0_1_ = 1;
      if (local_70._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        uVar11 = 0;
        bVar8 = 0;
        _Var12._M_nxt = local_70._M_before_begin._M_nxt;
        do {
          p_Var3 = _Var12._M_nxt + 1;
          p_Var4 = _Var12._M_nxt + 4;
          p_Var5 = _Var12._M_nxt + 3;
          _Var12._M_nxt = (_Var12._M_nxt)->_M_nxt;
          bVar8 = bVar8 | (Clause *)p_Var3->_M_nxt == *(this->_func).premise;
          uVar11 = uVar11 + (int)((ulong)((long)p_Var4->_M_nxt - (long)p_Var5->_M_nxt) >> 3);
        } while (_Var12._M_nxt != (_Hash_node_base *)0x0);
        if ((bool)(bVar8 & 1 < uVar11)) {
          local_138._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
          _M_impl.super__Vector_impl_data._M_start = local_88;
          local_138._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)VStack_80;
          local_138._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
          local_88 = (pointer)0x0;
          VStack_80 = (Value)0x0;
          local_78 = (pointer)0x0;
          std::
          _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_Hashtable(&local_138._cls._M_h,&local_70);
          OptionBase<Inferences::InductionContext>::OptionBase
                    ((OptionBase<Inferences::InductionContext> *)&local_e8,&local_138);
          OptionBase<Inferences::InductionContext>::operator=
                    (local_148,(OptionBase<Inferences::InductionContext> *)&local_e8);
          OptionBase<Inferences::InductionContext>::~OptionBase
                    ((OptionBase<Inferences::InductionContext> *)&local_e8);
          std::
          _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&local_138._cls._M_h);
          if (local_138._indTerms.
              super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_138._indTerms.
                            super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_138._indTerms.
                                  super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_138._indTerms.
                                  super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          unaff_RBP = (Value)0x0;
        }
      }
      std::
      _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_70);
      if (local_88 != (pointer)0x0) {
        operator_delete(local_88,(long)local_78 - (long)local_88);
      }
      pFVar10 = (FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>
                 *)(ulong)local_14c;
    } while (unaff_RBP._0_1_ != '\0');
  }
  return SUB81(pFVar10,0);
}

Assistant:

bool hasNext()
  {
    if(_next.isSome()) {
      return true;
    }
    while(_inn.hasNext()) {
      OWN_ELEMENT_TYPE next = move_if_value<OWN_ELEMENT_TYPE>(_inn.next());
      if(_func(next)) {
        _next = Option<OWN_ELEMENT_TYPE>(move_if_value<OWN_ELEMENT_TYPE>(next));
        return true;
      } else {
        __doDeletion<deleteFilteredOut>{}(_inn);
      }
    }
    return false;
  }